

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt_and_hash.c
# Opt level: O0

int main(int argc,char **argv)

{
  uchar *input;
  long lVar1;
  undefined8 uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  mbedtls_cipher_info_t *pmVar6;
  mbedtls_md_info_t *pmVar7;
  char *pcVar8;
  FILE *pFVar9;
  ulong uVar10;
  FILE *pFVar11;
  size_t sVar12;
  uint local_bc4;
  uint local_b7c;
  mbedtls_md_type_t *local_b60;
  int *list;
  off_t offset;
  off_t filesize;
  mbedtls_md_context_t md_ctx;
  mbedtls_cipher_context_t cipher_ctx;
  mbedtls_md_info_t *md_info;
  mbedtls_cipher_info_t *cipher_info;
  uchar local_ab8 [7];
  uchar diff;
  uchar output [1024];
  uchar buffer [1024];
  uchar digest [64];
  uchar key [512];
  uchar IV [16];
  char *p;
  FILE *fout;
  FILE *fin;
  FILE *fkey;
  size_t olen;
  size_t ilen;
  size_t keylen;
  int local_28;
  int mode;
  int exit_code;
  int n;
  int i;
  int ret;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  n = 1;
  local_28 = 1;
  fout = (FILE *)0x0;
  p = (char *)0x0;
  _i = argv;
  argv_local._0_4_ = argc;
  mbedtls_cipher_init((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx);
  mbedtls_md_init((mbedtls_md_context_t *)&filesize);
  if ((int)argv_local == 7) {
    keylen._4_4_ = atoi(_i[1]);
    if ((keylen._4_4_ == 0) || (keylen._4_4_ == 1)) {
      iVar4 = strcmp(_i[2],_i[3]);
      if (iVar4 == 0) {
        fprintf(_stderr,"input and output filenames must differ\n");
      }
      else {
        fout = (FILE *)fopen(_i[2],"rb");
        if ((FILE *)fout == (FILE *)0x0) {
          fprintf(_stderr,"fopen(%s,rb) failed\n",_i[2]);
        }
        else {
          p = (char *)fopen(_i[3],"wb+");
          if ((FILE *)p == (FILE *)0x0) {
            fprintf(_stderr,"fopen(%s,wb+) failed\n",_i[3]);
          }
          else {
            pmVar6 = mbedtls_cipher_info_from_string(_i[4]);
            if (pmVar6 == (mbedtls_cipher_info_t *)0x0) {
              fprintf(_stderr,"Cipher \'%s\' not found\n",_i[4]);
            }
            else {
              n = mbedtls_cipher_setup((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx,pmVar6);
              if (n == 0) {
                pmVar7 = mbedtls_md_info_from_string(_i[5]);
                if (pmVar7 == (mbedtls_md_info_t *)0x0) {
                  fprintf(_stderr,"Message Digest \'%s\' not found\n",_i[5]);
                }
                else {
                  iVar4 = mbedtls_md_setup((mbedtls_md_context_t *)&filesize,pmVar7,1);
                  if (iVar4 == 0) {
                    pFVar9 = fopen(_i[6],"rb");
                    if (pFVar9 == (FILE *)0x0) {
                      if (*(int *)_i[6] == 0x3a786568) {
                        IV._8_8_ = _i[6] + 4;
                        ilen = 0;
                        while (iVar4 = __isoc99_sscanf(IV._8_8_,"%02X",&mode),
                              0 < iVar4 && ilen < 0x200) {
                          lVar1 = ilen + 0x38;
                          ilen = ilen + 1;
                          digest[lVar1] = (uchar)mode;
                          IV._8_8_ = IV._8_8_ + 2;
                        }
                      }
                      else {
                        ilen = strlen(_i[6]);
                        if (0x200 < ilen) {
                          ilen = 0x200;
                        }
                        memcpy(digest + 0x38,_i[6],ilen);
                      }
                    }
                    else {
                      ilen = fread(digest + 0x38,1,0x200,pFVar9);
                      fclose(pFVar9);
                    }
                    iVar4 = fileno((FILE *)fout);
                    uVar10 = lseek(iVar4,0,2);
                    if ((long)uVar10 < 0) {
                      perror("lseek");
                    }
                    else {
                      iVar4 = fseek((FILE *)fout,0,0);
                      if (iVar4 < 0) {
                        fprintf(_stderr,"fseek(0,SEEK_SET) failed\n");
                      }
                      else {
                        if (keylen._4_4_ == 0) {
                          for (exit_code = 0; exit_code < 8; exit_code = exit_code + 1) {
                            output[(long)exit_code + 0x3f8] =
                                 (uchar)((long)uVar10 >> ((byte)(exit_code << 3) & 0x3f));
                          }
                          input = (uchar *)_i[2];
                          mbedtls_md_starts((mbedtls_md_context_t *)&filesize);
                          mbedtls_md_update((mbedtls_md_context_t *)&filesize,output + 0x3f8,8);
                          sVar12 = strlen((char *)input);
                          mbedtls_md_update((mbedtls_md_context_t *)&filesize,input,sVar12);
                          mbedtls_md_finish((mbedtls_md_context_t *)&filesize,buffer + 0x3f8);
                          uVar2 = digest._0_8_;
                          key[0x1f8] = buffer[0x3f8];
                          key[0x1f9] = buffer[0x3f9];
                          key[0x1fa] = buffer[0x3fa];
                          key[0x1fb] = buffer[0x3fb];
                          key[0x1fc] = buffer[0x3fc];
                          key[0x1fd] = buffer[0x3fd];
                          key[0x1fe] = buffer[0x3fe];
                          key[0x1ff] = buffer[0x3ff];
                          sVar12 = fwrite(key + 0x1f8,1,0x10,(FILE *)p);
                          if (sVar12 != 0x10) {
                            fprintf(_stderr,"fwrite(%d bytes) failed\n",0x10);
                            goto LAB_0010726b;
                          }
                          memset(buffer + 0x3f8,0,0x20);
                          buffer[0x3f8] = key[0x1f8];
                          buffer[0x3f9] = key[0x1f9];
                          buffer[0x3fa] = key[0x1fa];
                          buffer[0x3fb] = key[0x1fb];
                          buffer[0x3fc] = key[0x1fc];
                          buffer[0x3fd] = key[0x1fd];
                          buffer[0x3fe] = key[0x1fe];
                          buffer[0x3ff] = key[0x1ff];
                          digest._0_8_ = uVar2;
                          for (exit_code = 0; exit_code < 0x2000; exit_code = exit_code + 1) {
                            mbedtls_md_starts((mbedtls_md_context_t *)&filesize);
                            mbedtls_md_update((mbedtls_md_context_t *)&filesize,buffer + 0x3f8,0x20)
                            ;
                            mbedtls_md_update((mbedtls_md_context_t *)&filesize,digest + 0x38,ilen);
                            mbedtls_md_finish((mbedtls_md_context_t *)&filesize,buffer + 0x3f8);
                          }
                          iVar4 = mbedtls_cipher_setkey
                                            ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx,
                                             buffer + 0x3f8,pmVar6->key_bitlen,MBEDTLS_ENCRYPT);
                          if (iVar4 != 0) {
                            fprintf(_stderr,"mbedtls_cipher_setkey() returned error\n");
                            goto LAB_0010726b;
                          }
                          iVar4 = mbedtls_cipher_set_iv
                                            ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx,
                                             key + 0x1f8,0x10);
                          if (iVar4 != 0) {
                            fprintf(_stderr,"mbedtls_cipher_set_iv() returned error\n");
                            goto LAB_0010726b;
                          }
                          iVar4 = mbedtls_cipher_reset((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx)
                          ;
                          if (iVar4 != 0) {
                            fprintf(_stderr,"mbedtls_cipher_reset() returned error\n");
                            goto LAB_0010726b;
                          }
                          mbedtls_md_hmac_starts
                                    ((mbedtls_md_context_t *)&filesize,buffer + 0x3f8,0x20);
                          for (list = (int *)0x0; (long)list < (long)uVar10;
                              list = (int *)((ulong)uVar5 + (long)list)) {
                            uVar5 = mbedtls_cipher_get_block_size
                                              ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx);
                            if ((long)(ulong)uVar5 < (long)((uVar10 & 0xffffffff) - (long)list)) {
                              local_b7c = mbedtls_cipher_get_block_size
                                                    ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx);
                            }
                            else {
                              local_b7c = (int)uVar10 - (int)list;
                            }
                            olen = (size_t)local_b7c;
                            sVar12 = fread(output + 0x3f8,1,olen,(FILE *)fout);
                            if (sVar12 != olen) {
                              fprintf(_stderr,"fread(%ld bytes) failed\n",olen);
                              goto LAB_0010726b;
                            }
                            iVar4 = mbedtls_cipher_update
                                              ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx,
                                               output + 0x3f8,olen,local_ab8,(size_t *)&fkey);
                            if (iVar4 != 0) {
                              fprintf(_stderr,"mbedtls_cipher_update() returned error\n");
                              goto LAB_0010726b;
                            }
                            mbedtls_md_hmac_update
                                      ((mbedtls_md_context_t *)&filesize,local_ab8,(size_t)fkey);
                            pFVar11 = (FILE *)fwrite(local_ab8,1,(size_t)fkey,(FILE *)p);
                            if (pFVar11 != fkey) {
                              fprintf(_stderr,"fwrite(%ld bytes) failed\n",fkey);
                              goto LAB_0010726b;
                            }
                            uVar5 = mbedtls_cipher_get_block_size
                                              ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx);
                          }
                          iVar4 = mbedtls_cipher_finish
                                            ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx,local_ab8,
                                             (size_t *)&fkey);
                          if (iVar4 != 0) {
                            fprintf(_stderr,"mbedtls_cipher_finish() returned error\n");
                            goto LAB_0010726b;
                          }
                          mbedtls_md_hmac_update
                                    ((mbedtls_md_context_t *)&filesize,local_ab8,(size_t)fkey);
                          pFVar11 = (FILE *)fwrite(local_ab8,1,(size_t)fkey,(FILE *)p);
                          if (pFVar11 != fkey) {
                            fprintf(_stderr,"fwrite(%ld bytes) failed\n",fkey);
                            goto LAB_0010726b;
                          }
                          mbedtls_md_hmac_finish((mbedtls_md_context_t *)&filesize,buffer + 0x3f8);
                          bVar3 = mbedtls_md_get_size(pmVar7);
                          sVar12 = fwrite(buffer + 0x3f8,1,(ulong)bVar3,(FILE *)p);
                          bVar3 = mbedtls_md_get_size(pmVar7);
                          pFVar9 = _stderr;
                          if (sVar12 != bVar3) {
                            bVar3 = mbedtls_md_get_size(pmVar7);
                            fprintf(pFVar9,"fwrite(%d bytes) failed\n",(ulong)bVar3);
                            goto LAB_0010726b;
                          }
                        }
                        if (keylen._4_4_ == 1) {
                          bVar3 = mbedtls_md_get_size(pmVar7);
                          if ((long)uVar10 < (long)(int)(bVar3 + 0x10)) {
                            fprintf(_stderr,"File too short to be encrypted.\n");
                            goto LAB_0010726b;
                          }
                          uVar5 = mbedtls_cipher_get_block_size
                                            ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx);
                          if (uVar5 == 0) {
                            fprintf(_stderr,"Invalid cipher block size: 0. \n");
                            goto LAB_0010726b;
                          }
                          if (pmVar6->mode != MBEDTLS_MODE_GCM) {
                            bVar3 = mbedtls_md_get_size(pmVar7);
                            uVar5 = mbedtls_cipher_get_block_size
                                              ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx);
                            pFVar9 = _stderr;
                            if ((long)(uVar10 - bVar3) % (long)(ulong)uVar5 != 0) {
                              uVar5 = mbedtls_cipher_get_block_size
                                                ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx);
                              fprintf(pFVar9,"File content not a multiple of the block size (%d).\n"
                                      ,(ulong)uVar5);
                              goto LAB_0010726b;
                            }
                          }
                          bVar3 = mbedtls_md_get_size(pmVar7);
                          uVar10 = uVar10 - (long)(int)(bVar3 + 0x10);
                          sVar12 = fread(output + 0x3f8,1,0x10,(FILE *)fout);
                          if (sVar12 != 0x10) {
                            fprintf(_stderr,"fread(%d bytes) failed\n",0x10);
                            goto LAB_0010726b;
                          }
                          key[0x1f8] = output[0x3f8];
                          key[0x1f9] = output[0x3f9];
                          key[0x1fa] = output[0x3fa];
                          key[0x1fb] = output[0x3fb];
                          key[0x1fc] = output[0x3fc];
                          key[0x1fd] = output[0x3fd];
                          key[0x1fe] = output[0x3fe];
                          key[0x1ff] = output[0x3ff];
                          memset(buffer + 0x3f8,0,0x20);
                          buffer[0x3f8] = key[0x1f8];
                          buffer[0x3f9] = key[0x1f9];
                          buffer[0x3fa] = key[0x1fa];
                          buffer[0x3fb] = key[0x1fb];
                          buffer[0x3fc] = key[0x1fc];
                          buffer[0x3fd] = key[0x1fd];
                          buffer[0x3fe] = key[0x1fe];
                          buffer[0x3ff] = key[0x1ff];
                          digest[0] = buffer[0];
                          digest[1] = buffer[1];
                          digest[2] = buffer[2];
                          digest[3] = buffer[3];
                          digest[4] = buffer[4];
                          digest[5] = buffer[5];
                          digest[6] = buffer[6];
                          digest[7] = buffer[7];
                          for (exit_code = 0; exit_code < 0x2000; exit_code = exit_code + 1) {
                            mbedtls_md_starts((mbedtls_md_context_t *)&filesize);
                            mbedtls_md_update((mbedtls_md_context_t *)&filesize,buffer + 0x3f8,0x20)
                            ;
                            mbedtls_md_update((mbedtls_md_context_t *)&filesize,digest + 0x38,ilen);
                            mbedtls_md_finish((mbedtls_md_context_t *)&filesize,buffer + 0x3f8);
                          }
                          iVar4 = mbedtls_cipher_setkey
                                            ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx,
                                             buffer + 0x3f8,pmVar6->key_bitlen,MBEDTLS_DECRYPT);
                          if (iVar4 != 0) {
                            fprintf(_stderr,"mbedtls_cipher_setkey() returned error\n");
                            goto LAB_0010726b;
                          }
                          iVar4 = mbedtls_cipher_set_iv
                                            ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx,
                                             key + 0x1f8,0x10);
                          if (iVar4 != 0) {
                            fprintf(_stderr,"mbedtls_cipher_set_iv() returned error\n");
                            goto LAB_0010726b;
                          }
                          iVar4 = mbedtls_cipher_reset((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx)
                          ;
                          if (iVar4 != 0) {
                            fprintf(_stderr,"mbedtls_cipher_reset() returned error\n");
                            goto LAB_0010726b;
                          }
                          mbedtls_md_hmac_starts
                                    ((mbedtls_md_context_t *)&filesize,buffer + 0x3f8,0x20);
                          for (list = (int *)0x0; (long)list < (long)uVar10;
                              list = (int *)((ulong)uVar5 + (long)list)) {
                            uVar5 = mbedtls_cipher_get_block_size
                                              ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx);
                            if ((long)(ulong)uVar5 < (long)((uVar10 & 0xffffffff) - (long)list)) {
                              local_bc4 = mbedtls_cipher_get_block_size
                                                    ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx);
                            }
                            else {
                              local_bc4 = (int)uVar10 - (int)list;
                            }
                            olen = (size_t)local_bc4;
                            sVar12 = fread(output + 0x3f8,1,olen,(FILE *)fout);
                            pFVar9 = _stderr;
                            if (sVar12 != olen) {
                              uVar5 = mbedtls_cipher_get_block_size
                                                ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx);
                              fprintf(pFVar9,"fread(%d bytes) failed\n",(ulong)uVar5);
                              goto LAB_0010726b;
                            }
                            mbedtls_md_hmac_update
                                      ((mbedtls_md_context_t *)&filesize,output + 0x3f8,olen);
                            iVar4 = mbedtls_cipher_update
                                              ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx,
                                               output + 0x3f8,olen,local_ab8,(size_t *)&fkey);
                            if (iVar4 != 0) {
                              fprintf(_stderr,"mbedtls_cipher_update() returned error\n");
                              goto LAB_0010726b;
                            }
                            pFVar11 = (FILE *)fwrite(local_ab8,1,(size_t)fkey,(FILE *)p);
                            if (pFVar11 != fkey) {
                              fprintf(_stderr,"fwrite(%ld bytes) failed\n",fkey);
                              goto LAB_0010726b;
                            }
                            uVar5 = mbedtls_cipher_get_block_size
                                              ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx);
                          }
                          mbedtls_md_hmac_finish((mbedtls_md_context_t *)&filesize,buffer + 0x3f8);
                          bVar3 = mbedtls_md_get_size(pmVar7);
                          sVar12 = fread(output + 0x3f8,1,(ulong)bVar3,(FILE *)fout);
                          bVar3 = mbedtls_md_get_size(pmVar7);
                          pFVar9 = _stderr;
                          if (sVar12 != bVar3) {
                            bVar3 = mbedtls_md_get_size(pmVar7);
                            fprintf(pFVar9,"fread(%d bytes) failed\n",(ulong)bVar3);
                            goto LAB_0010726b;
                          }
                          cipher_info._7_1_ = 0;
                          for (exit_code = 0; iVar4 = exit_code, bVar3 = mbedtls_md_get_size(pmVar7)
                              , iVar4 < (int)(uint)bVar3; exit_code = exit_code + 1) {
                            cipher_info._7_1_ =
                                 cipher_info._7_1_ |
                                 buffer[(long)exit_code + 0x3f8] ^ output[(long)exit_code + 0x3f8];
                          }
                          if (cipher_info._7_1_ != 0) {
                            fprintf(_stderr,"HMAC check failed: wrong key, or file corrupted.\n");
                            goto LAB_0010726b;
                          }
                          mbedtls_cipher_finish
                                    ((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx,local_ab8,
                                     (size_t *)&fkey);
                          pFVar11 = (FILE *)fwrite(local_ab8,1,(size_t)fkey,(FILE *)p);
                          if (pFVar11 != fkey) {
                            fprintf(_stderr,"fwrite(%ld bytes) failed\n",fkey);
                            goto LAB_0010726b;
                          }
                        }
                        local_28 = 0;
                      }
                    }
                  }
                  else {
                    fprintf(_stderr,"mbedtls_md_setup failed\n");
                  }
                }
              }
              else {
                fprintf(_stderr,"mbedtls_cipher_setup failed\n");
              }
            }
          }
        }
      }
    }
    else {
      fprintf(_stderr,"invalid operation mode\n");
    }
  }
  else {
    printf(
          "\n  crypt_and_hash <mode> <input filename> <output filename> <cipher> <mbedtls_md> <key>\n\n   <mode>: 0 = encrypt, 1 = decrypt\n\n  example: crypt_and_hash 0 file file.aes AES-128-CBC SHA1 hex:E76B2413958B00E193\n\n"
          );
    printf("Available ciphers:\n");
    for (local_b60 = (mbedtls_md_type_t *)mbedtls_cipher_list(); *local_b60 != MBEDTLS_CIPHER_NONE;
        local_b60 = local_b60 + 1) {
      pmVar6 = mbedtls_cipher_info_from_type(*local_b60);
      printf("  %s\n",pmVar6->name);
    }
    printf("\nAvailable message digests:\n");
    for (local_b60 = (mbedtls_md_type_t *)mbedtls_md_list(); *local_b60 != MBEDTLS_MD_NONE;
        local_b60 = local_b60 + 1) {
      pmVar7 = mbedtls_md_info_from_type(*local_b60);
      pcVar8 = mbedtls_md_get_name(pmVar7);
      printf("  %s\n",pcVar8);
    }
  }
LAB_0010726b:
  if (fout != (FILE *)0x0) {
    fclose((FILE *)fout);
  }
  if (p != (char *)0x0) {
    fclose((FILE *)p);
  }
  for (exit_code = 0; exit_code < (int)argv_local; exit_code = exit_code + 1) {
    pcVar8 = _i[exit_code];
    sVar12 = strlen(_i[exit_code]);
    mbedtls_platform_zeroize(pcVar8,sVar12);
  }
  mbedtls_platform_zeroize(key + 0x1f8,0x10);
  mbedtls_platform_zeroize(digest + 0x38,0x200);
  mbedtls_platform_zeroize(output + 0x3f8,0x400);
  mbedtls_platform_zeroize(local_ab8,0x400);
  mbedtls_platform_zeroize(buffer + 0x3f8,0x40);
  mbedtls_cipher_free((mbedtls_cipher_context_t *)&md_ctx.hmac_ctx);
  mbedtls_md_free((mbedtls_md_context_t *)&filesize);
  return local_28;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1, i, n;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    int mode;
    size_t keylen, ilen, olen;
    FILE *fkey, *fin = NULL, *fout = NULL;

    char *p;
    unsigned char IV[16];
    unsigned char key[512];
    unsigned char digest[MBEDTLS_MD_MAX_SIZE];
    unsigned char buffer[1024];
    unsigned char output[1024];
    unsigned char diff;

    const mbedtls_cipher_info_t *cipher_info;
    const mbedtls_md_info_t *md_info;
    mbedtls_cipher_context_t cipher_ctx;
    mbedtls_md_context_t md_ctx;
#if defined(_WIN32_WCE)
    long filesize, offset;
#elif defined(_WIN32)
       LARGE_INTEGER li_size;
    __int64 filesize, offset;
#else
      off_t filesize, offset;
#endif

    mbedtls_cipher_init( &cipher_ctx );
    mbedtls_md_init( &md_ctx );

    /*
     * Parse the command-line arguments.
     */
    if( argc != 7 )
    {
        const int *list;

        mbedtls_printf( USAGE );

        mbedtls_printf( "Available ciphers:\n" );
        list = mbedtls_cipher_list();
        while( *list )
        {
            cipher_info = mbedtls_cipher_info_from_type( *list );
            mbedtls_printf( "  %s\n", cipher_info->name );
            list++;
        }

        mbedtls_printf( "\nAvailable message digests:\n" );
        list = mbedtls_md_list();
        while( *list )
        {
            md_info = mbedtls_md_info_from_type( *list );
            mbedtls_printf( "  %s\n", mbedtls_md_get_name( md_info ) );
            list++;
        }

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        goto exit;
    }

    mode = atoi( argv[1] );

    if( mode != MODE_ENCRYPT && mode != MODE_DECRYPT )
    {
        mbedtls_fprintf( stderr, "invalid operation mode\n" );
        goto exit;
    }

    if( strcmp( argv[2], argv[3] ) == 0 )
    {
        mbedtls_fprintf( stderr, "input and output filenames must differ\n" );
        goto exit;
    }

    if( ( fin = fopen( argv[2], "rb" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,rb) failed\n", argv[2] );
        goto exit;
    }

    if( ( fout = fopen( argv[3], "wb+" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,wb+) failed\n", argv[3] );
        goto exit;
    }

    /*
     * Read the Cipher and MD from the command line
     */
    cipher_info = mbedtls_cipher_info_from_string( argv[4] );
    if( cipher_info == NULL )
    {
        mbedtls_fprintf( stderr, "Cipher '%s' not found\n", argv[4] );
        goto exit;
    }
    if( ( ret = mbedtls_cipher_setup( &cipher_ctx, cipher_info) ) != 0 )
    {
        mbedtls_fprintf( stderr, "mbedtls_cipher_setup failed\n" );
        goto exit;
    }

    md_info = mbedtls_md_info_from_string( argv[5] );
    if( md_info == NULL )
    {
        mbedtls_fprintf( stderr, "Message Digest '%s' not found\n", argv[5] );
        goto exit;
    }

    if( mbedtls_md_setup( &md_ctx, md_info, 1 ) != 0 )
    {
        mbedtls_fprintf( stderr, "mbedtls_md_setup failed\n" );
        goto exit;
    }

    /*
     * Read the secret key from file or command line
     */
    if( ( fkey = fopen( argv[6], "rb" ) ) != NULL )
    {
        keylen = fread( key, 1, sizeof( key ), fkey );
        fclose( fkey );
    }
    else
    {
        if( memcmp( argv[6], "hex:", 4 ) == 0 )
        {
            p = &argv[6][4];
            keylen = 0;

            while( sscanf( p, "%02X", &n ) > 0 &&
                   keylen < (int) sizeof( key ) )
            {
                key[keylen++] = (unsigned char) n;
                p += 2;
            }
        }
        else
        {
            keylen = strlen( argv[6] );

            if( keylen > (int) sizeof( key ) )
                keylen = (int) sizeof( key );

            memcpy( key, argv[6], keylen );
        }
    }

#if defined(_WIN32_WCE)
    filesize = fseek( fin, 0L, SEEK_END );
#else
#if defined(_WIN32)
    /*
     * Support large files (> 2Gb) on Win32
     */
    li_size.QuadPart = 0;
    li_size.LowPart  =
        SetFilePointer( (HANDLE) _get_osfhandle( _fileno( fin ) ),
                        li_size.LowPart, &li_size.HighPart, FILE_END );

    if( li_size.LowPart == 0xFFFFFFFF && GetLastError() != NO_ERROR )
    {
        mbedtls_fprintf( stderr, "SetFilePointer(0,FILE_END) failed\n" );
        goto exit;
    }

    filesize = li_size.QuadPart;
#else
    if( ( filesize = lseek( fileno( fin ), 0, SEEK_END ) ) < 0 )
    {
        perror( "lseek" );
        goto exit;
    }
#endif
#endif

    if( fseek( fin, 0, SEEK_SET ) < 0 )
    {
        mbedtls_fprintf( stderr, "fseek(0,SEEK_SET) failed\n" );
        goto exit;
    }

    if( mode == MODE_ENCRYPT )
    {
        /*
         * Generate the initialization vector as:
         * IV = MD( filesize || filename )[0..15]
         */
        for( i = 0; i < 8; i++ )
            buffer[i] = (unsigned char)( filesize >> ( i << 3 ) );

        p = argv[2];

        mbedtls_md_starts( &md_ctx );
        mbedtls_md_update( &md_ctx, buffer, 8 );
        mbedtls_md_update( &md_ctx, (unsigned char *) p, strlen( p ) );
        mbedtls_md_finish( &md_ctx, digest );

        memcpy( IV, digest, 16 );

        /*
         * Append the IV at the beginning of the output.
         */
        if( fwrite( IV, 1, 16, fout ) != 16 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &md_ctx );
            mbedtls_md_update( &md_ctx, digest, 32 );
            mbedtls_md_update( &md_ctx, key, keylen );
            mbedtls_md_finish( &md_ctx, digest );

        }

        if( mbedtls_cipher_setkey( &cipher_ctx, digest, cipher_info->key_bitlen,
                           MBEDTLS_ENCRYPT ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_setkey() returned error\n");
            goto exit;
        }
        if( mbedtls_cipher_set_iv( &cipher_ctx, IV, 16 ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_set_iv() returned error\n");
            goto exit;
        }
        if( mbedtls_cipher_reset( &cipher_ctx ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_reset() returned error\n");
            goto exit;
        }

        mbedtls_md_hmac_starts( &md_ctx, digest, 32 );

        /*
         * Encrypt and write the ciphertext.
         */
        for( offset = 0; offset < filesize; offset += mbedtls_cipher_get_block_size( &cipher_ctx ) )
        {
            ilen = ( (unsigned int) filesize - offset > mbedtls_cipher_get_block_size( &cipher_ctx ) ) ?
                mbedtls_cipher_get_block_size( &cipher_ctx ) : (unsigned int) ( filesize - offset );

            if( fread( buffer, 1, ilen, fin ) != ilen )
            {
                mbedtls_fprintf( stderr, "fread(%ld bytes) failed\n", (long) ilen );
                goto exit;
            }

            if( mbedtls_cipher_update( &cipher_ctx, buffer, ilen, output, &olen ) != 0 )
            {
                mbedtls_fprintf( stderr, "mbedtls_cipher_update() returned error\n");
                goto exit;
            }

            mbedtls_md_hmac_update( &md_ctx, output, olen );

            if( fwrite( output, 1, olen, fout ) != olen )
            {
                mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
                goto exit;
            }
        }

        if( mbedtls_cipher_finish( &cipher_ctx, output, &olen ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_finish() returned error\n" );
            goto exit;
        }
        mbedtls_md_hmac_update( &md_ctx, output, olen );

        if( fwrite( output, 1, olen, fout ) != olen )
        {
            mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
            goto exit;
        }

        /*
         * Finally write the HMAC.
         */
        mbedtls_md_hmac_finish( &md_ctx, digest );

        if( fwrite( digest, 1, mbedtls_md_get_size( md_info ), fout ) != mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", mbedtls_md_get_size( md_info ) );
            goto exit;
        }
    }

    if( mode == MODE_DECRYPT )
    {
        /*
         *  The encrypted file must be structured as follows:
         *
         *        00 .. 15              Initialization Vector
         *        16 .. 31              Encrypted Block #1
         *           ..
         *      N*16 .. (N+1)*16 - 1    Encrypted Block #N
         *  (N+1)*16 .. (N+1)*16 + n    Hash(ciphertext)
         */
        if( filesize < 16 + mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "File too short to be encrypted.\n" );
            goto exit;
        }

        if( mbedtls_cipher_get_block_size( &cipher_ctx ) == 0 )
        {
            mbedtls_fprintf( stderr, "Invalid cipher block size: 0. \n" );
            goto exit;
        }

        /*
         * Check the file size.
         */
        if( cipher_info->mode != MBEDTLS_MODE_GCM &&
            ( ( filesize - mbedtls_md_get_size( md_info ) ) %
                mbedtls_cipher_get_block_size( &cipher_ctx ) ) != 0 )
        {
            mbedtls_fprintf( stderr, "File content not a multiple of the block size (%d).\n",
                     mbedtls_cipher_get_block_size( &cipher_ctx ));
            goto exit;
        }

        /*
         * Subtract the IV + HMAC length.
         */
        filesize -= ( 16 + mbedtls_md_get_size( md_info ) );

        /*
         * Read the IV and original filesize modulo 16.
         */
        if( fread( buffer, 1, 16, fin ) != 16 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
            goto exit;
        }

        memcpy( IV, buffer, 16 );

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &md_ctx );
            mbedtls_md_update( &md_ctx, digest, 32 );
            mbedtls_md_update( &md_ctx, key, keylen );
            mbedtls_md_finish( &md_ctx, digest );
        }

        if( mbedtls_cipher_setkey( &cipher_ctx, digest, cipher_info->key_bitlen,
                           MBEDTLS_DECRYPT ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_setkey() returned error\n" );
            goto exit;
        }

        if( mbedtls_cipher_set_iv( &cipher_ctx, IV, 16 ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_set_iv() returned error\n" );
            goto exit;
        }

        if( mbedtls_cipher_reset( &cipher_ctx ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_reset() returned error\n" );
            goto exit;
        }

        mbedtls_md_hmac_starts( &md_ctx, digest, 32 );

        /*
         * Decrypt and write the plaintext.
         */
        for( offset = 0; offset < filesize; offset += mbedtls_cipher_get_block_size( &cipher_ctx ) )
        {
            ilen = ( (unsigned int) filesize - offset > mbedtls_cipher_get_block_size( &cipher_ctx ) ) ?
                mbedtls_cipher_get_block_size( &cipher_ctx ) : (unsigned int) ( filesize - offset );

            if( fread( buffer, 1, ilen, fin ) != ilen )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n",
                    mbedtls_cipher_get_block_size( &cipher_ctx ) );
                goto exit;
            }

            mbedtls_md_hmac_update( &md_ctx, buffer, ilen );
            if( mbedtls_cipher_update( &cipher_ctx, buffer, ilen, output,
                                       &olen ) != 0 )
            {
                mbedtls_fprintf( stderr, "mbedtls_cipher_update() returned error\n" );
                goto exit;
            }

            if( fwrite( output, 1, olen, fout ) != olen )
            {
                mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
                goto exit;
            }
        }

        /*
         * Verify the message authentication code.
         */
        mbedtls_md_hmac_finish( &md_ctx, digest );

        if( fread( buffer, 1, mbedtls_md_get_size( md_info ), fin ) != mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", mbedtls_md_get_size( md_info ) );
            goto exit;
        }

        /* Use constant-time buffer comparison */
        diff = 0;
        for( i = 0; i < mbedtls_md_get_size( md_info ); i++ )
            diff |= digest[i] ^ buffer[i];

        if( diff != 0 )
        {
            mbedtls_fprintf( stderr, "HMAC check failed: wrong key, "
                             "or file corrupted.\n" );
            goto exit;
        }

        /*
         * Write the final block of data
         */
        mbedtls_cipher_finish( &cipher_ctx, output, &olen );

        if( fwrite( output, 1, olen, fout ) != olen )
        {
            mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
            goto exit;
        }
    }

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:
    if( fin )
        fclose( fin );
    if( fout )
        fclose( fout );

    /* Zeroize all command line arguments to also cover
       the case when the user has missed or reordered some,
       in which case the key might not be in argv[6]. */
    for( i = 0; i < argc; i++ )
        mbedtls_platform_zeroize( argv[i], strlen( argv[i] ) );

    mbedtls_platform_zeroize( IV,     sizeof( IV ) );
    mbedtls_platform_zeroize( key,    sizeof( key ) );
    mbedtls_platform_zeroize( buffer, sizeof( buffer ) );
    mbedtls_platform_zeroize( output, sizeof( output ) );
    mbedtls_platform_zeroize( digest, sizeof( digest ) );

    mbedtls_cipher_free( &cipher_ctx );
    mbedtls_md_free( &md_ctx );

    return( exit_code );
}